

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

void __thiscall capnp::FlatMessageBuilder::~FlatMessageBuilder(FlatMessageBuilder *this)

{
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__FlatMessageBuilder_006d2338;
  if ((this->super_MessageBuilder).allocatedArena == true) {
    capnp::_::BuilderArena::~BuilderArena((BuilderArena *)(this->super_MessageBuilder).arenaSpace);
  }
  operator_delete(this,0xd8);
  return;
}

Assistant:

FlatMessageBuilder::~FlatMessageBuilder() noexcept(false) {}